

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O2

pair<vec3f,_vec3f> * __thiscall
BsplineCurve::atParam(pair<vec3f,_vec3f> *__return_storage_ptr__,BsplineCurve *this,double t)

{
  pointer pvVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  undefined8 *puVar16;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vec3f vVar30;
  long lStack_80;
  double local_78 [2];
  pair<vec3f,_vec3f> *local_68;
  double local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  float local_34;
  ulong uVar7;
  
  local_68 = __return_storage_ptr__;
  lStack_80 = 0xc;
  iVar4 = (int)(((long)(this->super_Curve).controls.
                       super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc);
  uVar6 = iVar4 + 3;
  uVar7 = (ulong)uVar6;
  dVar3 = (double)(int)uVar6;
  local_60 = (double)iVar4 / dVar3 - 3.0 / dVar3;
  dVar2 = t * local_60 + 3.0 / dVar3;
  pdVar14 = local_78 + uVar7 * -4;
  uVar9 = 0;
  uVar11 = 0;
  pdVar13 = pdVar14;
  if (0 < (int)uVar6) {
    uVar11 = (ulong)uVar6;
  }
  while (uVar11 != uVar9) {
    iVar8 = (int)uVar9;
    uVar9 = uVar9 + 1;
    *pdVar13 = (double)(~-(ulong)(dVar2 < (double)iVar8 / dVar3) &
                       -(ulong)(dVar2 < (double)(int)uVar9 / dVar3) & 0x3ff0000000000000);
    pdVar13 = pdVar13 + 4;
  }
  (&lStack_80)[uVar7 * -4] = 1;
  lVar10 = (&lStack_80)[uVar7 * -4];
  (&lStack_80)[uVar7 * -4] = 2;
  lVar12 = (&lStack_80)[uVar7 * -4];
  for (; lVar10 != 4; lVar10 = lVar10 + 1) {
    lVar15 = 0;
    pdVar13 = pdVar14;
    while (lVar10 + lVar15 < (long)(int)uVar6) {
      iVar8 = (int)lVar15;
      auVar18._4_4_ = 0;
      auVar18._0_4_ = (int)lVar10 + iVar8;
      auVar18._8_4_ = iVar8;
      auVar18._12_4_ = 0;
      auVar19._0_8_ = SUB168(auVar18 | _DAT_00146a40,0) - (double)DAT_00146a40;
      auVar19._8_8_ = SUB168(auVar18 | _DAT_00146a40,8) - DAT_00146a40._8_8_;
      auVar20._8_8_ = dVar3;
      auVar20._0_8_ = dVar3;
      auVar20 = divpd(auVar19,auVar20);
      lVar15 = lVar15 + 1;
      auVar27._4_4_ = 0;
      auVar27._0_4_ = (int)lVar12 + iVar8;
      auVar27._8_4_ = (int)lVar15;
      auVar27._12_4_ = 0;
      auVar28._0_8_ = SUB168(auVar27 | _DAT_00146a40,0) - (double)DAT_00146a40;
      auVar28._8_8_ = SUB168(auVar27 | _DAT_00146a40,8) - DAT_00146a40._8_8_;
      auVar29._8_8_ = dVar3;
      auVar29._0_8_ = dVar3;
      auVar29 = divpd(auVar28,auVar29);
      pdVar13[1] = ((dVar2 - auVar20._8_8_) / (auVar20._0_8_ - auVar20._8_8_)) * *pdVar13 +
                   ((auVar29._0_8_ - dVar2) / (auVar29._0_8_ - auVar29._8_8_)) * pdVar13[4];
      pdVar13 = pdVar13 + 4;
    }
    pdVar14 = pdVar14 + 1;
    lVar12 = lVar12 + 1;
  }
  local_78[0] = dVar3;
  local_78[1] = dVar3;
  puVar16 = &local_48 + uVar7 * -4;
  local_38 = 0.0;
  lVar10 = 0;
  local_34 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0.0;
  fStack_54 = 0.0;
  fStack_50 = 0.0;
  fStack_4c = 0.0;
  uVar9 = 0;
  while ((long)uVar9 <= (long)(iVar4 + -1)) {
    pvVar1 = (this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = (double)puVar16[-3];
    (&lStack_80)[uVar7 * -4] = 0x12d3f3;
    vVar30 = operator*((vec3f *)((long)&pvVar1->x + lVar10),(float)dVar2);
    local_48 = CONCAT44(local_48._4_4_ + vVar30.y,(float)local_48 + vVar30.x);
    uStack_40 = CONCAT44(uStack_40._4_4_ + extraout_XMM0_Dd,(float)uStack_40 + extraout_XMM0_Dc);
    local_34 = local_34 + vVar30.z;
    pvVar1 = (this->super_Curve).controls.super__Vector_base<vec3f,_std::allocator<vec3f>_>._M_impl.
             super__Vector_impl_data._M_start;
    (&lStack_80)[uVar7 * -4] = 0x12d420;
    vVar30 = operator*((vec3f *)((long)&pvVar1->x + lVar10),3.0);
    auVar24._0_4_ = (int)uVar9 + 3;
    auVar24._4_4_ = 0;
    auVar24._8_4_ = (int)uVar9 + 4;
    auVar24._12_4_ = 0;
    auVar25._0_8_ = SUB168(auVar24 | _DAT_00146a40,0) - (double)DAT_00146a40;
    auVar25._8_8_ = SUB168(auVar24 | _DAT_00146a40,8) - DAT_00146a40._8_8_;
    auVar5._8_8_ = local_78[1];
    auVar5._0_8_ = local_78[0];
    auVar29 = divpd(auVar25,auVar5);
    auVar21._0_8_ = uVar9 & 0xffffffff;
    auVar21._8_4_ = (int)(uVar9 + 1);
    auVar21._12_4_ = 0;
    auVar22._0_8_ = SUB168(auVar21 | _DAT_00146a40,0) - (double)DAT_00146a40;
    auVar22._8_8_ = SUB168(auVar21 | _DAT_00146a40,8) - DAT_00146a40._8_8_;
    auVar20 = divpd(auVar22,auVar5);
    auVar26._0_8_ = auVar29._0_8_ - auVar20._0_8_;
    auVar26._8_8_ = auVar29._8_8_ - auVar20._8_8_;
    auVar23._8_8_ = *puVar16;
    auVar23._0_8_ = puVar16[-4];
    auVar20 = divpd(auVar23,auVar26);
    fVar17 = (float)(auVar20._0_8_ - auVar20._8_8_);
    local_58 = local_58 + fVar17 * vVar30.x;
    fStack_54 = fStack_54 + fVar17 * vVar30.y;
    fStack_50 = fStack_50 + fVar17 * extraout_XMM0_Dc_00;
    fStack_4c = fStack_4c + fVar17 * extraout_XMM0_Dd_00;
    local_38 = local_38 + vVar30.z * fVar17;
    puVar16 = puVar16 + 4;
    lVar10 = lVar10 + 0xc;
    uVar9 = uVar9 + 1;
  }
  fVar17 = (float)local_60;
  (local_68->first).x = (float)local_48;
  (local_68->first).y = local_48._4_4_;
  (local_68->first).z = local_34;
  (local_68->second).x = local_58 * fVar17;
  (local_68->second).y = fStack_54 * fVar17;
  (local_68->second).z = local_38 * fVar17;
  return local_68;
}

Assistant:

std::pair<vec3f, vec3f> atParam(double t) const
    {
        const int n = controls.size()-1;
        const int k = 3;
        double tmin = (double)k/(n+k+1);
        double tmax = (double)(n+1)/(n+k+1);
        // de-normalize parameter
        t = tmin + t * (tmax - tmin);

        #define t_(i) ((double)(i)/(n+k+1))
        double B[n+k+1][k+1];
        for (int i=0; i<n+k+1; ++i)
            B[i][0] = (t_(i)<=t && t<t_(i+1))? 1: 0;
        for (int p=1; p<=k; ++p)
            for (int i=0; i+p<n+k+1; ++i)
                B[i][p] = (t-t_(i))/(t_(i+p)-t_(i))*B[i][p-1] + (t_(i+p+1)-t)/(t_(i+p+1)-t_(i+1))*B[i+1][p-1];
        vec3f res(0), der(0);
        double t0=0;
        for (int i=0; i<=n; ++i) {
            res += controls[i] * B[i][k];
            t0 += B[i][k];
            der += controls[i] * k * (B[i][k-1]/(t_(i+k)-t_(i)) - B[i+1][k-1]/(t_(i+k+1)-t_(i+1)));
        }
        #undef t_
        return {res, der * (tmax-tmin)};
    }